

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O2

void h2v1_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  uint uVar1;
  int iVar2;
  jpeg_upsampler *pjVar3;
  JSAMPLE *pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  ulong uVar7;
  JSAMPROW pJVar8;
  JSAMPROW pJVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var15;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var16;
  _func_void_j_decompress_ptr *p_Var17;
  long lVar18;
  long lVar19;
  long local_48;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var16 = pjVar3[1].upsample;
    local_48 = *(long *)&pjVar3[1].need_context_rows;
    p_Var17 = pjVar3[2].start_pass;
    p_Var15 = pjVar3[2].upsample;
    pJVar8 = (*input_buf)[in_row_group_ctr];
    pJVar9 = input_buf[1][in_row_group_ctr];
    pJVar5 = input_buf[2][in_row_group_ctr];
    pJVar6 = *output_buf;
    uVar1 = cinfo->output_width;
    for (lVar10 = 0; uVar1 >> 1 != (uint)lVar10; lVar10 = lVar10 + 1) {
      iVar2 = *(int *)(p_Var16 + (ulong)pJVar5[lVar10] * 4);
      lVar14 = *(long *)(p_Var17 + (ulong)pJVar5[lVar10] * 8);
      lVar13 = *(long *)(p_Var15 + (ulong)pJVar9[lVar10] * 8);
      lVar12 = (long)*(int *)(local_48 + (ulong)pJVar9[lVar10] * 4);
      uVar7 = (ulong)pJVar8[lVar10 * 2];
      *pJVar6 = pJVar4[uVar7 + (long)iVar2];
      lVar14 = (long)(int)((ulong)(lVar14 + lVar13) >> 0x10);
      pJVar6[1] = pJVar4[uVar7 + lVar14];
      pJVar6[2] = pJVar4[uVar7 + lVar12];
      uVar7 = (ulong)pJVar8[lVar10 * 2 + 1];
      pJVar6[3] = pJVar4[(long)iVar2 + uVar7];
      pJVar6[4] = pJVar4[lVar14 + uVar7];
      pJVar6[5] = pJVar4[lVar12 + uVar7];
      pJVar6 = pJVar6 + 6;
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var16 = pjVar3[1].upsample;
    lVar10 = *(long *)&pjVar3[1].need_context_rows;
    p_Var17 = pjVar3[2].start_pass;
    p_Var15 = pjVar3[2].upsample;
    pJVar6 = (*input_buf)[in_row_group_ctr];
    pJVar8 = input_buf[1][in_row_group_ctr];
    pJVar9 = input_buf[2][in_row_group_ctr];
    pJVar5 = *output_buf;
    uVar1 = cinfo->output_width;
    for (lVar14 = 0; uVar1 >> 1 != (uint)lVar14; lVar14 = lVar14 + 1) {
      uVar7 = (ulong)pJVar8[lVar14];
      uVar11 = (ulong)pJVar9[lVar14];
      lVar18 = (long)*(int *)(p_Var16 + uVar11 * 4);
      lVar13 = *(long *)(p_Var17 + uVar11 * 8);
      lVar12 = *(long *)(p_Var15 + uVar7 * 8);
      lVar19 = (long)*(int *)(lVar10 + uVar7 * 4);
      uVar7 = (ulong)pJVar6[lVar14 * 2];
      pJVar5[lVar14 * 8] = pJVar4[lVar18 + uVar7];
      lVar13 = (long)(int)((ulong)(lVar13 + lVar12) >> 0x10);
      pJVar5[lVar14 * 8 + 1] = pJVar4[uVar7 + lVar13];
      pJVar5[lVar14 * 8 + 2] = pJVar4[uVar7 + lVar19];
      pJVar5[lVar14 * 8 + 3] = 0xff;
      uVar7 = (ulong)pJVar6[lVar14 * 2 + 1];
      pJVar5[lVar14 * 8 + 4] = pJVar4[lVar18 + uVar7];
      pJVar5[lVar14 * 8 + 5] = pJVar4[lVar13 + uVar7];
      pJVar5[lVar14 * 8 + 6] = pJVar4[lVar19 + uVar7];
      pJVar5[lVar14 * 8 + 7] = 0xff;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    uVar11 = (ulong)pJVar8[lVar14];
    uVar7 = (ulong)pJVar9[lVar14];
    lVar13 = *(long *)(p_Var17 + uVar7 * 8);
    lVar12 = *(long *)(p_Var15 + uVar11 * 8);
    iVar2 = *(int *)(lVar10 + uVar11 * 4);
    uVar11 = (ulong)pJVar6[lVar14 * 2];
    pJVar5[lVar14 * 8] = pJVar4[(long)*(int *)(p_Var16 + uVar7 * 4) + uVar11];
    pJVar5[lVar14 * 8 + 1] = pJVar4[(long)(int)((ulong)(lVar13 + lVar12) >> 0x10) + uVar11];
    pJVar5[lVar14 * 8 + 2] = pJVar4[(long)iVar2 + uVar11];
    goto LAB_001232ec;
  case JCS_EXT_BGR:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var16 = pjVar3[1].upsample;
    lVar10 = *(long *)&pjVar3[1].need_context_rows;
    p_Var17 = pjVar3[2].start_pass;
    p_Var15 = pjVar3[2].upsample;
    pJVar6 = (*input_buf)[in_row_group_ctr];
    pJVar8 = input_buf[1][in_row_group_ctr];
    pJVar9 = input_buf[2][in_row_group_ctr];
    pJVar5 = *output_buf;
    uVar1 = cinfo->output_width;
    for (lVar14 = 0; uVar1 >> 1 != (uint)lVar14; lVar14 = lVar14 + 1) {
      uVar7 = (ulong)pJVar8[lVar14];
      uVar11 = (ulong)pJVar9[lVar14];
      lVar19 = (long)*(int *)(p_Var16 + uVar11 * 4);
      lVar13 = *(long *)(p_Var17 + uVar11 * 8);
      lVar12 = *(long *)(p_Var15 + uVar7 * 8);
      lVar18 = (long)*(int *)(lVar10 + uVar7 * 4);
      uVar7 = (ulong)pJVar6[lVar14 * 2];
      pJVar5[2] = pJVar4[lVar19 + uVar7];
      lVar13 = (long)(int)((ulong)(lVar13 + lVar12) >> 0x10);
      pJVar5[1] = pJVar4[lVar13 + uVar7];
      *pJVar5 = pJVar4[uVar7 + lVar18];
      uVar7 = (ulong)pJVar6[lVar14 * 2 + 1];
      pJVar5[5] = pJVar4[lVar19 + uVar7];
      pJVar5[4] = pJVar4[lVar13 + uVar7];
      pJVar5[3] = pJVar4[lVar18 + uVar7];
      pJVar5 = pJVar5 + 6;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    uVar7 = (ulong)pJVar8[lVar14];
    uVar11 = (ulong)pJVar9[lVar14];
    lVar13 = *(long *)(p_Var17 + uVar11 * 8);
    lVar12 = *(long *)(p_Var15 + uVar7 * 8);
    iVar2 = *(int *)(lVar10 + uVar7 * 4);
    uVar7 = (ulong)pJVar6[lVar14 * 2];
    pJVar5[2] = pJVar4[(long)*(int *)(p_Var16 + uVar11 * 4) + uVar7];
    pJVar5[1] = pJVar4[(long)(int)((ulong)(lVar13 + lVar12) >> 0x10) + uVar7];
    *pJVar5 = pJVar4[(long)iVar2 + uVar7];
    return;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var16 = pjVar3[1].upsample;
    lVar10 = *(long *)&pjVar3[1].need_context_rows;
    p_Var17 = pjVar3[2].start_pass;
    p_Var15 = pjVar3[2].upsample;
    pJVar6 = (*input_buf)[in_row_group_ctr];
    pJVar8 = input_buf[1][in_row_group_ctr];
    pJVar9 = input_buf[2][in_row_group_ctr];
    pJVar5 = *output_buf;
    uVar1 = cinfo->output_width;
    for (lVar14 = 0; uVar1 >> 1 != (uint)lVar14; lVar14 = lVar14 + 1) {
      uVar7 = (ulong)pJVar8[lVar14];
      uVar11 = (ulong)pJVar9[lVar14];
      lVar18 = (long)*(int *)(p_Var16 + uVar11 * 4);
      lVar13 = *(long *)(p_Var17 + uVar11 * 8);
      lVar12 = *(long *)(p_Var15 + uVar7 * 8);
      lVar19 = (long)*(int *)(lVar10 + uVar7 * 4);
      uVar7 = (ulong)pJVar6[lVar14 * 2];
      pJVar5[lVar14 * 8 + 2] = pJVar4[lVar18 + uVar7];
      lVar13 = (long)(int)((ulong)(lVar13 + lVar12) >> 0x10);
      pJVar5[lVar14 * 8 + 1] = pJVar4[uVar7 + lVar13];
      pJVar5[lVar14 * 8] = pJVar4[uVar7 + lVar19];
      pJVar5[lVar14 * 8 + 3] = 0xff;
      uVar7 = (ulong)pJVar6[lVar14 * 2 + 1];
      pJVar5[lVar14 * 8 + 6] = pJVar4[lVar18 + uVar7];
      pJVar5[lVar14 * 8 + 5] = pJVar4[lVar13 + uVar7];
      pJVar5[lVar14 * 8 + 4] = pJVar4[lVar19 + uVar7];
      pJVar5[lVar14 * 8 + 7] = 0xff;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    uVar11 = (ulong)pJVar8[lVar14];
    uVar7 = (ulong)pJVar9[lVar14];
    lVar13 = *(long *)(p_Var17 + uVar7 * 8);
    lVar12 = *(long *)(p_Var15 + uVar11 * 8);
    iVar2 = *(int *)(lVar10 + uVar11 * 4);
    uVar11 = (ulong)pJVar6[lVar14 * 2];
    pJVar5[lVar14 * 8 + 2] = pJVar4[(long)*(int *)(p_Var16 + uVar7 * 4) + uVar11];
    pJVar5[lVar14 * 8 + 1] = pJVar4[(long)(int)((ulong)(lVar13 + lVar12) >> 0x10) + uVar11];
    pJVar5[lVar14 * 8] = pJVar4[(long)iVar2 + uVar11];
LAB_001232ec:
    pJVar5[lVar14 * 8 + 3] = 0xff;
    return;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var16 = pjVar3[1].upsample;
    lVar10 = *(long *)&pjVar3[1].need_context_rows;
    p_Var17 = pjVar3[2].start_pass;
    p_Var15 = pjVar3[2].upsample;
    pJVar6 = (*input_buf)[in_row_group_ctr];
    pJVar8 = input_buf[1][in_row_group_ctr];
    pJVar9 = input_buf[2][in_row_group_ctr];
    pJVar5 = *output_buf;
    uVar1 = cinfo->output_width;
    for (lVar14 = 0; uVar1 >> 1 != (uint)lVar14; lVar14 = lVar14 + 1) {
      uVar7 = (ulong)pJVar8[lVar14];
      uVar11 = (ulong)pJVar9[lVar14];
      lVar18 = (long)*(int *)(p_Var16 + uVar11 * 4);
      lVar13 = *(long *)(p_Var17 + uVar11 * 8);
      lVar12 = *(long *)(p_Var15 + uVar7 * 8);
      lVar19 = (long)*(int *)(lVar10 + uVar7 * 4);
      uVar7 = (ulong)pJVar6[lVar14 * 2];
      pJVar5[lVar14 * 8 + 3] = pJVar4[lVar18 + uVar7];
      lVar13 = (long)(int)((ulong)(lVar13 + lVar12) >> 0x10);
      pJVar5[lVar14 * 8 + 2] = pJVar4[uVar7 + lVar13];
      pJVar5[lVar14 * 8 + 1] = pJVar4[uVar7 + lVar19];
      pJVar5[lVar14 * 8] = 0xff;
      uVar7 = (ulong)pJVar6[lVar14 * 2 + 1];
      pJVar5[lVar14 * 8 + 7] = pJVar4[lVar18 + uVar7];
      pJVar5[lVar14 * 8 + 6] = pJVar4[lVar13 + uVar7];
      pJVar5[lVar14 * 8 + 5] = pJVar4[lVar19 + uVar7];
      pJVar5[lVar14 * 8 + 4] = 0xff;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    uVar11 = (ulong)pJVar8[lVar14];
    uVar7 = (ulong)pJVar9[lVar14];
    lVar13 = *(long *)(p_Var17 + uVar7 * 8);
    lVar12 = *(long *)(p_Var15 + uVar11 * 8);
    iVar2 = *(int *)(lVar10 + uVar11 * 4);
    uVar11 = (ulong)pJVar6[lVar14 * 2];
    pJVar5[lVar14 * 8 + 3] = pJVar4[(long)*(int *)(p_Var16 + uVar7 * 4) + uVar11];
    pJVar5[lVar14 * 8 + 2] = pJVar4[(long)(int)((ulong)(lVar13 + lVar12) >> 0x10) + uVar11];
    pJVar5[lVar14 * 8 + 1] = pJVar4[(long)iVar2 + uVar11];
    goto LAB_00123281;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var16 = pjVar3[1].upsample;
    lVar10 = *(long *)&pjVar3[1].need_context_rows;
    p_Var17 = pjVar3[2].start_pass;
    p_Var15 = pjVar3[2].upsample;
    pJVar6 = (*input_buf)[in_row_group_ctr];
    pJVar8 = input_buf[1][in_row_group_ctr];
    pJVar9 = input_buf[2][in_row_group_ctr];
    pJVar5 = *output_buf;
    uVar1 = cinfo->output_width;
    for (lVar14 = 0; uVar1 >> 1 != (uint)lVar14; lVar14 = lVar14 + 1) {
      uVar7 = (ulong)pJVar8[lVar14];
      uVar11 = (ulong)pJVar9[lVar14];
      lVar18 = (long)*(int *)(p_Var16 + uVar11 * 4);
      lVar13 = *(long *)(p_Var17 + uVar11 * 8);
      lVar12 = *(long *)(p_Var15 + uVar7 * 8);
      lVar19 = (long)*(int *)(lVar10 + uVar7 * 4);
      uVar7 = (ulong)pJVar6[lVar14 * 2];
      pJVar5[lVar14 * 8 + 1] = pJVar4[lVar18 + uVar7];
      lVar13 = (long)(int)((ulong)(lVar13 + lVar12) >> 0x10);
      pJVar5[lVar14 * 8 + 2] = pJVar4[uVar7 + lVar13];
      pJVar5[lVar14 * 8 + 3] = pJVar4[uVar7 + lVar19];
      pJVar5[lVar14 * 8] = 0xff;
      uVar7 = (ulong)pJVar6[lVar14 * 2 + 1];
      pJVar5[lVar14 * 8 + 5] = pJVar4[lVar18 + uVar7];
      pJVar5[lVar14 * 8 + 6] = pJVar4[lVar13 + uVar7];
      pJVar5[lVar14 * 8 + 7] = pJVar4[lVar19 + uVar7];
      pJVar5[lVar14 * 8 + 4] = 0xff;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    uVar11 = (ulong)pJVar8[lVar14];
    uVar7 = (ulong)pJVar9[lVar14];
    lVar13 = *(long *)(p_Var17 + uVar7 * 8);
    lVar12 = *(long *)(p_Var15 + uVar11 * 8);
    iVar2 = *(int *)(lVar10 + uVar11 * 4);
    uVar11 = (ulong)pJVar6[lVar14 * 2];
    pJVar5[lVar14 * 8 + 1] = pJVar4[(long)*(int *)(p_Var16 + uVar7 * 4) + uVar11];
    pJVar5[lVar14 * 8 + 2] = pJVar4[(long)(int)((ulong)(lVar13 + lVar12) >> 0x10) + uVar11];
    pJVar5[lVar14 * 8 + 3] = pJVar4[(long)iVar2 + uVar11];
LAB_00123281:
    pJVar5[lVar14 * 8] = 0xff;
    return;
  default:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var16 = pjVar3[1].upsample;
    local_48 = *(long *)&pjVar3[1].need_context_rows;
    p_Var17 = pjVar3[2].start_pass;
    p_Var15 = pjVar3[2].upsample;
    pJVar8 = (*input_buf)[in_row_group_ctr];
    pJVar9 = input_buf[1][in_row_group_ctr];
    pJVar5 = input_buf[2][in_row_group_ctr];
    pJVar6 = *output_buf;
    uVar1 = cinfo->output_width;
    for (lVar10 = 0; uVar1 >> 1 != (uint)lVar10; lVar10 = lVar10 + 1) {
      iVar2 = *(int *)(p_Var16 + (ulong)pJVar5[lVar10] * 4);
      lVar14 = *(long *)(p_Var17 + (ulong)pJVar5[lVar10] * 8);
      lVar13 = *(long *)(p_Var15 + (ulong)pJVar9[lVar10] * 8);
      lVar12 = (long)*(int *)(local_48 + (ulong)pJVar9[lVar10] * 4);
      uVar7 = (ulong)pJVar8[lVar10 * 2];
      *pJVar6 = pJVar4[(long)iVar2 + uVar7];
      lVar14 = (long)(int)((ulong)(lVar14 + lVar13) >> 0x10);
      pJVar6[1] = pJVar4[lVar14 + uVar7];
      pJVar6[2] = pJVar4[uVar7 + lVar12];
      uVar7 = (ulong)pJVar8[lVar10 * 2 + 1];
      pJVar6[3] = pJVar4[(long)iVar2 + uVar7];
      pJVar6[4] = pJVar4[lVar14 + uVar7];
      pJVar6[5] = pJVar4[lVar12 + uVar7];
      pJVar6 = pJVar6 + 6;
    }
  }
  if ((cinfo->output_width & 1) != 0) {
    lVar14 = *(long *)(p_Var17 + (ulong)pJVar5[lVar10] * 8);
    lVar13 = *(long *)(p_Var15 + (ulong)pJVar9[lVar10] * 8);
    iVar2 = *(int *)(local_48 + (ulong)pJVar9[lVar10] * 4);
    uVar7 = (ulong)pJVar8[lVar10 * 2];
    *pJVar6 = pJVar4[(long)*(int *)(p_Var16 + (ulong)pJVar5[lVar10] * 4) + uVar7];
    pJVar6[1] = pJVar4[(long)(int)((ulong)(lVar14 + lVar13) >> 0x10) + uVar7];
    pJVar6[2] = pJVar4[(long)iVar2 + uVar7];
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_merged_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                     JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    extrgb_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_BGR:
    extbgr_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  default:
    h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                  output_buf);
    break;
  }
}